

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_matchers_impl.hpp
# Opt level: O0

void __thiscall
Catch::MatchExpr<slang::SVInt_&,_SVIntExactlyEqualMatcher>::streamReconstructedExpression
          (MatchExpr<slang::SVInt_&,_SVIntExactlyEqualMatcher> *this,ostream *os)

{
  ostream *poVar1;
  ostream *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  SVInt *in_stack_ffffffffffffff78;
  string local_60 [8];
  MatcherUntypedBase *in_stack_ffffffffffffffa8;
  string local_30 [48];
  
  Detail::stringify<slang::SVInt>(in_stack_ffffffffffffff78);
  poVar1 = std::operator<<(in_RSI,local_30);
  poVar1 = std::operator<<(poVar1,' ');
  Matchers::MatcherUntypedBase::toString_abi_cxx11_(in_stack_ffffffffffffffa8);
  std::operator<<(poVar1,local_60);
  std::__cxx11::string::~string(in_RDI);
  std::__cxx11::string::~string(in_RDI);
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream& os ) const override {
            os << Catch::Detail::stringify( m_arg )
               << ' '
               << m_matcher.toString();
        }